

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

SharedPtr<deqp::egl::GLES2ThreadTest::Texture> __thiscall
deqp::egl::GLES2ThreadTest::GLES2ResourceManager::popTexture(GLES2ResourceManager *this,int index)

{
  reference other;
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
  *this_00;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> SVar1;
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>_>
  local_38;
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>_>
  local_30;
  const_iterator local_28;
  undefined1 local_1d;
  int local_1c;
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
  *pvStack_18;
  int index_local;
  GLES2ResourceManager *this_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture;
  
  this_00 = (vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
             *)CONCAT44(in_register_00000034,index);
  local_1d = 0;
  local_1c = in_EDX;
  pvStack_18 = this_00;
  this_local = this;
  other = std::
          vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
          ::operator[](this_00,(long)in_EDX);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)this,other);
  local_38._M_current =
       (SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)
       std::
       vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
       ::begin(this_00);
  local_30 = __gnu_cxx::
             __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>_>
             ::operator+(&local_38,(long)local_1c);
  __gnu_cxx::
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>const*,std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>>>>
  ::__normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>*>
            ((__normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>const*,std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>>>>
              *)&local_28,&local_30);
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
  ::erase(this_00,local_28);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (Texture *)this;
  return SVar1;
}

Assistant:

SharedPtr<Texture> GLES2ResourceManager::popTexture (int index)
{
	SharedPtr<Texture> texture = m_textures[index];

	m_textures.erase(m_textures.begin() + index);

	return texture;
}